

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObjectData::~QObjectData(QObjectData *this)

{
  Data *pDVar1;
  
  this->_vptr_QObjectData = (_func_int **)&PTR___cxa_pure_virtual_0069b118;
  QBindingStorage::~QBindingStorage(&this->bindingStorage);
  pDVar1 = (this->children).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->children).d.d)->super_QArrayData,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

QObjectData::~QObjectData() {}